

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  ImDrawList *this;
  bool *pbVar1;
  ImGuiID *pIVar2;
  long lVar3;
  ImVec2 *pIVar4;
  float *pfVar5;
  char cVar6;
  ImGuiID IVar7;
  ImGuiInputSource IVar8;
  ImGuiID IVar9;
  ImFontAtlas *pIVar10;
  uchar *puVar11;
  ImGuiWindow **ppIVar12;
  ImGuiPopupRef *pIVar13;
  ImVec2 IVar14;
  ImGuiContext *pIVar15;
  ImGuiContext *pIVar16;
  ImGuiContext *pIVar17;
  char *pcVar18;
  bool bVar19;
  bool bVar20;
  int i;
  int iVar21;
  long lVar22;
  char *pcVar23;
  size_t sVar24;
  char *__s;
  ulong uVar25;
  char *pcVar26;
  ImGuiSettingsHandler *pIVar27;
  void *pvVar28;
  ImFont *font;
  ImGuiWindow *pIVar29;
  ImGuiWindow **__dest;
  ImGuiPopupRef *__dest_00;
  bool bVar30;
  int i_1;
  ImGuiWindow *parent_window;
  ImGuiWindow *pIVar31;
  int iVar32;
  ImGuiWindow *window;
  ImGuiContext *g_1;
  float *pfVar33;
  ulong uVar34;
  ImGuiWindow *pIVar35;
  char *pcVar36;
  float *pfVar37;
  ImGuiContext *g;
  char *pcVar38;
  ImGuiWindow *old_nav_window;
  char *pcVar39;
  ImGuiNavMoveResult *pIVar40;
  char *pcVar41;
  bool bVar42;
  byte bVar43;
  uint uVar44;
  uint uVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  ImVec2 IVar49;
  ImVec2 IVar50;
  ImVec2 IVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  ImVec2 IVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  ImVec2 IVar59;
  ImVec2 local_40;
  float local_34;
  
  pIVar15 = GImGui;
  bVar43 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() or ImGui::SetCurrentContext()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd63,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd68,"void ImGui::NewFrame()");
  }
  if ((GImGui->IO).DeltaTime < 0.0) {
    __assert_fail("g.IO.DeltaTime >= 0.0f && \"Need a positive DeltaTime (zero is tolerated but will cause some timing issues)\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd69,"void ImGui::NewFrame()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd6a,"void ImGui::NewFrame()");
  }
  pIVar10 = (GImGui->IO).Fonts;
  if ((pIVar10->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd6b,"void ImGui::NewFrame()");
  }
  if ((*(pIVar10->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd6c,"void ImGui::NewFrame()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd6d,"void ImGui::NewFrame()");
  }
  fVar46 = (GImGui->Style).Alpha;
  if ((fVar46 < 0.0) || (1.0 < fVar46)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd6e,"void ImGui::NewFrame()");
  }
  if ((GImGui->FrameCount != 0) && (GImGui->FrameCountEnded != GImGui->FrameCount)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd6f,"void ImGui::NewFrame()");
  }
  lVar22 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar22] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown)/sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xd71,"void ImGui::NewFrame()");
    }
    lVar22 = lVar22 + 1;
  } while (lVar22 != 0x15);
  if ((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd75,"void ImGui::NewFrame()");
  }
  if (GImGui->SettingsLoaded == false) {
    if ((GImGui->SettingsWindows).Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xd7a,"void ImGui::NewFrame()");
    }
    pcVar23 = (GImGui->IO).IniFilename;
    if ((pcVar23 != (char *)0x0) &&
       (pcVar23 = (char *)ImFileLoadToMemory(pcVar23,"rb",(int *)0x0,1), pcVar23 != (char *)0x0)) {
      sVar24 = strlen(pcVar23);
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      __s = (char *)(*GImAllocatorAllocFunc)(sVar24 + 1,GImAllocatorUserData);
      memcpy(__s,pcVar23,sVar24 + 1);
      sVar24 = strlen(__s);
      pIVar16 = GImGui;
      if (0 < (long)sVar24) {
        pcVar38 = __s + sVar24;
        pvVar28 = (void *)0x0;
        pIVar27 = (ImGuiSettingsHandler *)0x0;
        pcVar39 = __s;
        do {
          for (; (*pcVar39 == '\n' || (*pcVar39 == '\r')); pcVar39 = pcVar39 + 1) {
          }
          uVar25 = 0;
          pcVar41 = pcVar39;
          if (pcVar39 < pcVar38) {
            do {
              if ((pcVar39[uVar25] == '\n') || (pcVar39[uVar25] == '\r')) break;
              lVar22 = uVar25 + 1;
              uVar25 = uVar25 + 1;
            } while (pcVar39 + lVar22 < pcVar38);
            pcVar41 = pcVar39 + uVar25;
          }
          *pcVar41 = '\0';
          if (((uVar25 == 0) || (*pcVar39 != '[')) || (pcVar39[uVar25 - 1] != ']')) {
            if ((pIVar27 != (ImGuiSettingsHandler *)0x0) && (pvVar28 != (void *)0x0)) {
              (*pIVar27->ReadLineFn)(pIVar16,pIVar27,pvVar28,pcVar39);
            }
          }
          else {
            pcVar39[uVar25 - 1] = '\0';
            if (2 < uVar25) {
              lVar22 = 1;
              do {
                if (pcVar39[lVar22] == ']') {
                  pcVar36 = pcVar39 + lVar22;
                  goto LAB_0014c728;
                }
                lVar3 = lVar22 - uVar25;
                lVar22 = lVar22 + 1;
              } while (lVar3 != -2);
            }
            pcVar36 = (char *)0x0;
LAB_0014c728:
            if (pcVar36 == (char *)0x0) {
LAB_0014c74f:
              pcVar26 = (char *)0x0;
            }
            else {
              pcVar26 = (char *)0x0;
              pcVar18 = pcVar36 + 1;
              if (pcVar36 + 1 < pcVar39 + (uVar25 - 1)) {
                do {
                  pcVar26 = pcVar18;
                  if (*pcVar26 == '[') goto LAB_0014c756;
                  pcVar18 = pcVar26 + 1;
                } while (pcVar26 + 1 != pcVar39 + (uVar25 - 1));
                goto LAB_0014c74f;
              }
            }
LAB_0014c756:
            pcVar39 = pcVar39 + 1;
            if (pcVar26 == (char *)0x0 || pcVar36 == (char *)0x0) {
              pcVar36 = "Window";
            }
            else {
              *pcVar36 = '\0';
              pcVar36 = pcVar39;
              pcVar39 = pcVar26 + 1;
            }
            pIVar27 = FindSettingsHandler(pcVar36);
            if (pIVar27 == (ImGuiSettingsHandler *)0x0) {
              pvVar28 = (void *)0x0;
            }
            else {
              pvVar28 = (*pIVar27->ReadOpenFn)(pIVar16,pIVar27,pcVar39);
            }
          }
          pcVar39 = pcVar41 + 1;
        } while (pcVar39 < pcVar38);
      }
      if (__s != (char *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(__s,GImAllocatorUserData);
      pIVar16->SettingsLoaded = true;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(pcVar23,GImAllocatorUserData);
    }
    pIVar15->SettingsLoaded = true;
  }
  if ((0.0 < pIVar15->SettingsDirtyTimer) &&
     (fVar46 = pIVar15->SettingsDirtyTimer - (pIVar15->IO).DeltaTime,
     pIVar15->SettingsDirtyTimer = fVar46, fVar46 <= 0.0)) {
    SaveIniSettingsToDisk((pIVar15->IO).IniFilename);
  }
  pIVar15->Time = (pIVar15->IO).DeltaTime + pIVar15->Time;
  pIVar15->FrameCount = pIVar15->FrameCount + 1;
  pIVar15->TooltipOverrideCount = 0;
  pIVar15->WindowsActiveCount = 0;
  font = GetDefaultFont();
  SetCurrentFont(font);
  if (pIVar15->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd8d,"void ImGui::NewFrame()");
  }
  fVar46 = (pIVar15->IO).DisplaySize.x;
  fVar53 = (pIVar15->IO).DisplaySize.y;
  (pIVar15->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar15->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar15->DrawListSharedData).ClipRectFullscreen.z = fVar46;
  (pIVar15->DrawListSharedData).ClipRectFullscreen.w = fVar53;
  (pIVar15->DrawListSharedData).CurveTessellationTol = (pIVar15->Style).CurveTessellationTol;
  this = &pIVar15->OverlayDrawList;
  ImDrawList::Clear(this);
  ImDrawList::PushTextureID(this,((pIVar15->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(this);
  (pIVar15->OverlayDrawList).Flags =
       (uint)(pIVar15->Style).AntiAliasedLines + (uint)(pIVar15->Style).AntiAliasedFill * 2;
  (pIVar15->DrawData).Valid = false;
  (pIVar15->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar15->DrawData).CmdListsCount = 0;
  (pIVar15->DrawData).TotalIdxCount = 0;
  (pIVar15->DrawData).TotalVtxCount = 0;
  if (pIVar15->HoveredIdPreviousFrame == 0) {
    pIVar15->HoveredIdTimer = 0.0;
  }
  pIVar15->HoveredIdPreviousFrame = pIVar15->HoveredId;
  pIVar15->HoveredId = 0;
  pIVar15->HoveredIdAllowOverlap = false;
  pIVar16 = GImGui;
  if ((pIVar15->ActiveIdIsAlive == false) &&
     (pIVar15->ActiveId != 0 && pIVar15->ActiveIdPreviousFrame == pIVar15->ActiveId)) {
    bVar42 = GImGui->ActiveId != 0;
    GImGui->ActiveIdIsJustActivated = bVar42;
    if (bVar42) {
      pIVar16->ActiveIdTimer = 0.0;
    }
    pIVar16->ActiveId = 0;
    pIVar16->ActiveIdAllowNavDirFlags = 0;
    pIVar16->ActiveIdAllowOverlap = false;
    pIVar16->ActiveIdWindow = (ImGuiWindow *)0x0;
  }
  IVar7 = pIVar15->ActiveId;
  if (IVar7 != 0) {
    pIVar15->ActiveIdTimer = (pIVar15->IO).DeltaTime + pIVar15->ActiveIdTimer;
  }
  pIVar15->ActiveIdPreviousFrame = IVar7;
  pIVar15->ActiveIdIsAlive = false;
  pIVar15->ActiveIdIsJustActivated = false;
  if (IVar7 != pIVar15->ScalarAsInputTextId && pIVar15->ScalarAsInputTextId != 0) {
    pIVar15->ScalarAsInputTextId = 0;
  }
  pIVar16 = GImGui;
  if ((pIVar15->DragDropActive == true) &&
     ((pIVar15->DragDropPayload).DataFrameCount + 1 < pIVar15->FrameCount)) {
    GImGui->DragDropActive = false;
    (pIVar16->DragDropPayload).DataType[0] = '\0';
    (pIVar16->DragDropPayload).DataType[1] = '\0';
    (pIVar16->DragDropPayload).DataType[2] = '\0';
    (pIVar16->DragDropPayload).DataType[3] = '\0';
    (pIVar16->DragDropPayload).DataType[4] = '\0';
    (pIVar16->DragDropPayload).DataType[5] = '\0';
    (pIVar16->DragDropPayload).DataType[6] = '\0';
    (pIVar16->DragDropPayload).DataType[7] = '\0';
    (pIVar16->DragDropPayload).DataType[8] = '\0';
    (pIVar16->DragDropPayload).DataType[9] = '\0';
    (pIVar16->DragDropPayload).DataType[10] = '\0';
    (pIVar16->DragDropPayload).DataType[0xb] = '\0';
    (pIVar16->DragDropPayload).DataType[0xc] = '\0';
    (pIVar16->DragDropPayload).DataType[0xd] = '\0';
    (pIVar16->DragDropPayload).DataType[0xe] = '\0';
    (pIVar16->DragDropPayload).DataType[0xf] = '\0';
    (pIVar16->DragDropPayload).DataType[0x10] = '\0';
    (pIVar16->DragDropPayload).DataType[0x11] = '\0';
    (pIVar16->DragDropPayload).DataType[0x12] = '\0';
    (pIVar16->DragDropPayload).DataType[0x13] = '\0';
    (pIVar16->DragDropPayload).DataType[0x14] = '\0';
    (pIVar16->DragDropPayload).DataType[0x15] = '\0';
    (pIVar16->DragDropPayload).DataType[0x16] = '\0';
    (pIVar16->DragDropPayload).DataType[0x17] = '\0';
    (pIVar16->DragDropPayload).DataType[0x18] = '\0';
    (pIVar16->DragDropPayload).DataType[0x19] = '\0';
    (pIVar16->DragDropPayload).DataType[0x1a] = '\0';
    (pIVar16->DragDropPayload).DataType[0x1b] = '\0';
    (pIVar16->DragDropPayload).DataType[0x1c] = '\0';
    (pIVar16->DragDropPayload).DataType[0x1d] = '\0';
    (pIVar16->DragDropPayload).DataType[0x1e] = '\0';
    (pIVar16->DragDropPayload).DataType[0x1f] = '\0';
    (pIVar16->DragDropPayload).DataType[0x20] = '\0';
    (pIVar16->DragDropPayload).Data = (void *)0x0;
    (pIVar16->DragDropPayload).DataSize = 0;
    (pIVar16->DragDropPayload).SourceId = 0;
    (pIVar16->DragDropPayload).SourceParentId = 0;
    (pIVar16->DragDropPayload).DataFrameCount = -1;
    (pIVar16->DragDropPayload).Preview = false;
    (pIVar16->DragDropPayload).Delivery = false;
    pIVar16->DragDropAcceptIdPrev = 0;
    pIVar16->DragDropAcceptFrameCount = -1;
    pIVar16->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
    pIVar16->DragDropAcceptIdCurr = 0;
    puVar11 = (pIVar15->DragDropPayloadBufHeap).Data;
    if (puVar11 != (uchar *)0x0) {
      (pIVar15->DragDropPayloadBufHeap).Size = 0;
      (pIVar15->DragDropPayloadBufHeap).Capacity = 0;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(puVar11,GImAllocatorUserData);
      (pIVar15->DragDropPayloadBufHeap).Data = (uchar *)0x0;
    }
    pIVar15->DragDropPayloadBufLocal[0] = '\0';
    pIVar15->DragDropPayloadBufLocal[1] = '\0';
    pIVar15->DragDropPayloadBufLocal[2] = '\0';
    pIVar15->DragDropPayloadBufLocal[3] = '\0';
    pIVar15->DragDropPayloadBufLocal[4] = '\0';
    pIVar15->DragDropPayloadBufLocal[5] = '\0';
    pIVar15->DragDropPayloadBufLocal[6] = '\0';
    pIVar15->DragDropPayloadBufLocal[7] = '\0';
  }
  pIVar15->DragDropAcceptIdPrev = pIVar15->DragDropAcceptIdCurr;
  pIVar15->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar15->DragDropAcceptIdCurr = 0;
  pfVar5 = (pIVar15->IO).KeysDownDuration;
  memcpy((pIVar15->IO).KeysDownDurationPrev,pfVar5,0x800);
  lVar22 = 0;
  do {
    fVar46 = -1.0;
    if ((pIVar15->IO).KeysDown[lVar22] == true) {
      fVar46 = 0.0;
      if (0.0 <= pfVar5[lVar22]) {
        fVar46 = pfVar5[lVar22] + (pIVar15->IO).DeltaTime;
      }
    }
    pfVar5[lVar22] = fVar46;
    pIVar16 = GImGui;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 0x200);
  (GImGui->IO).WantSetMousePos = false;
  uVar44 = (pIVar16->IO).ConfigFlags;
  if ((((uVar44 & 2) != 0) && (((pIVar16->IO).BackendFlags & 1) != 0)) &&
     ((0.0 < (pIVar16->IO).NavInputs[0] ||
      (((0.0 < (pIVar16->IO).NavInputs[2] || (0.0 < (pIVar16->IO).NavInputs[1])) ||
       (0.0 < (pIVar16->IO).NavInputs[3])))))) {
    pIVar16->NavInputSource = ImGuiInputSource_NavGamepad;
  }
  if ((uVar44 & 1) != 0) {
    iVar32 = (pIVar16->IO).KeyMap[0xc];
    if (-1 < (long)iVar32) {
      if (0x1ff < iVar32) goto LAB_0014ed15;
      if ((pIVar16->IO).KeysDown[iVar32] == true) {
        (pIVar16->IO).NavInputs[0] = 1.0;
        pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar32 = (pIVar16->IO).KeyMap[0xd];
    if (-1 < (long)iVar32) {
      if (0x1ff < iVar32) goto LAB_0014ed15;
      if ((pIVar16->IO).KeysDown[iVar32] == true) {
        (pIVar16->IO).NavInputs[2] = 1.0;
        pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar32 = (pIVar16->IO).KeyMap[0xe];
    if (-1 < (long)iVar32) {
      if (0x1ff < iVar32) goto LAB_0014ed15;
      if ((pIVar16->IO).KeysDown[iVar32] == true) {
        (pIVar16->IO).NavInputs[1] = 1.0;
        pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar32 = (pIVar16->IO).KeyMap[1];
    if (-1 < (long)iVar32) {
      if (0x1ff < iVar32) goto LAB_0014ed15;
      if ((pIVar16->IO).KeysDown[iVar32] == true) {
        (pIVar16->IO).NavInputs[0x11] = 1.0;
        pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar32 = (pIVar16->IO).KeyMap[2];
    if (-1 < (long)iVar32) {
      if (0x1ff < iVar32) goto LAB_0014ed15;
      if ((pIVar16->IO).KeysDown[iVar32] == true) {
        (pIVar16->IO).NavInputs[0x12] = 1.0;
        pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar32 = (pIVar16->IO).KeyMap[3];
    if (-1 < (long)iVar32) {
      if (0x1ff < iVar32) goto LAB_0014ed15;
      if ((pIVar16->IO).KeysDown[iVar32] == true) {
        (pIVar16->IO).NavInputs[0x13] = 1.0;
        pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar32 = (pIVar16->IO).KeyMap[4];
    if (-1 < (long)iVar32) {
      if (0x1ff < iVar32) {
LAB_0014ed15:
        __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(GImGui->IO.KeysDown)/sizeof(*GImGui->IO.KeysDown)))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                      ,0x11d0,"bool ImGui::IsKeyDown(int)");
      }
      if ((pIVar16->IO).KeysDown[iVar32] == true) {
        (pIVar16->IO).NavInputs[0x14] = 1.0;
        pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    if ((pIVar16->IO).KeyCtrl == true) {
      (pIVar16->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar16->IO).KeyShift == true) {
      (pIVar16->IO).NavInputs[0xf] = 1.0;
    }
    if ((pIVar16->IO).KeyAlt == true) {
      (pIVar16->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar5 = (pIVar16->IO).NavInputsDownDuration;
  pfVar33 = pfVar5;
  pfVar37 = (pIVar16->IO).NavInputsDownDurationPrev;
  for (lVar22 = 0x15; lVar22 != 0; lVar22 = lVar22 + -1) {
    *pfVar37 = *pfVar33;
    pfVar33 = pfVar33 + (ulong)bVar43 * -2 + 1;
    pfVar37 = pfVar37 + (ulong)bVar43 * -2 + 1;
  }
  lVar22 = 0;
  do {
    fVar46 = -1.0;
    if (0.0 < (pIVar16->IO).NavInputs[lVar22]) {
      fVar46 = 0.0;
      if (0.0 <= pfVar5[lVar22]) {
        fVar46 = pfVar5[lVar22] + (pIVar16->IO).DeltaTime;
      }
    }
    pfVar5[lVar22] = fVar46;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 0x15);
  IVar7 = pIVar16->NavInitResultId;
  if ((IVar7 != 0) &&
     ((pIVar16->NavDisableHighlight != true || (pIVar16->NavInitRequestFromMove == true)))) {
    if (pIVar16->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xbe1,"void ImGui::NavUpdate()");
    }
    iVar32 = pIVar16->NavLayer;
    if (pIVar16->NavInitRequestFromMove == true) {
      SetNavID(IVar7,iVar32);
      IVar49 = (pIVar16->NavInitResultRectRel).Max;
      pIVar4 = &pIVar16->NavWindow->NavRectRel[iVar32].Min;
      *pIVar4 = (pIVar16->NavInitResultRectRel).Min;
      pIVar4[1] = IVar49;
      pIVar16->NavMousePosDirty = true;
      pIVar16->NavDisableHighlight = false;
      pIVar16->NavDisableMouseHover = true;
    }
    else {
      SetNavID(IVar7,iVar32);
    }
    IVar49 = (pIVar16->NavInitResultRectRel).Max;
    pIVar4 = &pIVar16->NavWindow->NavRectRel[pIVar16->NavLayer].Min;
    *pIVar4 = (pIVar16->NavInitResultRectRel).Min;
    pIVar4[1] = IVar49;
  }
  pIVar16->NavInitRequest = false;
  pIVar16->NavInitRequestFromMove = false;
  pIVar16->NavInitResultId = 0;
  pIVar16->NavJustMovedToId = 0;
  pIVar17 = GImGui;
  if ((pIVar16->NavMoveRequest == true) &&
     ((IVar7 = (pIVar16->NavMoveResultLocal).ID, IVar7 != 0 ||
      ((pIVar16->NavMoveResultOther).ID != 0)))) {
    pIVar40 = &pIVar16->NavMoveResultLocal;
    if (IVar7 == 0) {
      pIVar40 = &pIVar16->NavMoveResultOther;
    }
    if (((pIVar16->NavMoveResultOther).ID != 0) &&
       (((pIVar16->NavMoveResultOther).Window)->ParentWindow == pIVar16->NavWindow)) {
      fVar46 = (pIVar16->NavMoveResultLocal).DistBox;
      fVar53 = (pIVar16->NavMoveResultOther).DistBox;
      if (fVar46 <= fVar53) {
        if (((fVar53 != fVar46) || (NAN(fVar53) || NAN(fVar46))) ||
           (fVar46 = (pIVar16->NavMoveResultLocal).DistCenter,
           pfVar5 = &(pIVar16->NavMoveResultOther).DistCenter, fVar46 < *pfVar5 || fVar46 == *pfVar5
           )) goto LAB_0014cf1e;
      }
      pIVar40 = &pIVar16->NavMoveResultOther;
    }
LAB_0014cf1e:
    if ((pIVar16->NavWindow == (ImGuiWindow *)0x0) ||
       (pIVar29 = pIVar40->Window, pIVar29 == (ImGuiWindow *)0x0)) {
      __assert_fail("g.NavWindow && result->Window",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xbf6,"void ImGui::NavUpdate()");
    }
    iVar32 = pIVar16->NavLayer;
    if ((long)iVar32 == 0) {
      fVar46 = (pIVar29->Pos).x;
      fVar53 = (pIVar29->Pos).y;
      fVar56 = ((pIVar29->InnerRect).Min.x - fVar46) + -1.0;
      fVar47 = ((pIVar29->InnerRect).Min.y - fVar53) + -1.0;
      fVar57 = ((pIVar29->InnerRect).Max.x - fVar46) + 1.0;
      fVar52 = ((pIVar29->InnerRect).Max.y - fVar53) + 1.0;
      fVar46 = (pIVar40->RectRel).Min.x;
      fVar53 = (pIVar40->RectRel).Min.y;
      fVar48 = (pIVar40->RectRel).Max.x;
      fVar54 = (pIVar40->RectRel).Max.y;
      if (((fVar46 < fVar56) || (fVar53 < fVar47)) || ((fVar57 < fVar48 || (fVar52 < fVar54)))) {
        if (fVar56 <= fVar46 || pIVar29->ScrollbarX != true) {
          if ((pIVar29->ScrollbarX != false) && (fVar57 <= fVar48)) {
            fVar56 = (pIVar29->Scroll).x + fVar48 + (GImGui->Style).ItemSpacing.x;
            fVar57 = 1.0;
            goto LAB_0014d037;
          }
        }
        else {
          fVar56 = ((pIVar29->Scroll).x + fVar46) - (GImGui->Style).ItemSpacing.x;
          fVar57 = 0.0;
LAB_0014d037:
          (pIVar29->ScrollTarget).x = fVar56;
          (pIVar29->ScrollTargetCenterRatio).x = fVar57;
        }
        if (fVar47 <= fVar53) {
          if (fVar52 <= fVar54) {
            fVar47 = (pIVar29->Scroll).y + fVar54 + (pIVar17->Style).ItemSpacing.y;
            fVar52 = 1.0;
            goto LAB_0014d08f;
          }
        }
        else {
          fVar47 = ((pIVar29->Scroll).y + fVar53) - (pIVar17->Style).ItemSpacing.y;
          fVar52 = 0.0;
LAB_0014d08f:
          (pIVar29->ScrollTarget).y = fVar47;
          (pIVar29->ScrollTargetCenterRatio).y = fVar52;
        }
        local_34 = fVar53;
        IVar49 = CalcNextScrollFromScrollTargetAndClamp(pIVar29);
        fVar53 = (pIVar29->Scroll).x - IVar49.x;
        fVar47 = (pIVar29->Scroll).y - IVar49.y;
        (pIVar40->RectRel).Min.x = fVar46 + fVar53;
        (pIVar40->RectRel).Min.y = local_34 + fVar47;
        (pIVar40->RectRel).Max.x = fVar48 + fVar53;
        (pIVar40->RectRel).Max.y = fVar54 + fVar47;
      }
    }
    pIVar17 = GImGui;
    bVar42 = GImGui->ActiveId != 0;
    GImGui->ActiveIdIsJustActivated = bVar42;
    if (bVar42) {
      pIVar17->ActiveIdTimer = 0.0;
    }
    pIVar17->ActiveId = 0;
    pIVar17->ActiveIdAllowNavDirFlags = 0;
    pIVar17->ActiveIdAllowOverlap = false;
    pIVar17->ActiveIdWindow = (ImGuiWindow *)0x0;
    pIVar16->NavWindow = pIVar29;
    SetNavID(pIVar40->ID,iVar32);
    IVar49 = (pIVar40->RectRel).Max;
    pIVar4 = &pIVar17->NavWindow->NavRectRel[iVar32].Min;
    *pIVar4 = (pIVar40->RectRel).Min;
    pIVar4[1] = IVar49;
    pIVar17->NavMousePosDirty = true;
    pIVar17->NavDisableHighlight = false;
    pIVar17->NavDisableMouseHover = true;
    pIVar16->NavJustMovedToId = pIVar40->ID;
    pIVar16->NavMoveFromClampedRefRect = false;
  }
  if (pIVar16->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar16->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xc07,"void ImGui::NavUpdate()");
    }
    if (((pIVar16->NavMoveResultLocal).ID == 0) && ((pIVar16->NavMoveResultOther).ID == 0)) {
      pIVar16->NavDisableHighlight = false;
    }
    pIVar16->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar16->NavMousePosDirty == true) && (pIVar16->NavIdIsAlive == true)) {
    if ((((pIVar16->IO).ConfigFlags & 4) != 0) && (((pIVar16->IO).BackendFlags & 4) != 0)) {
      if ((pIVar16->NavDisableHighlight != false) || (pIVar16->NavDisableMouseHover == false)) {
        __assert_fail("!g.NavDisableHighlight && g.NavDisableMouseHover",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                      ,0xc13,"void ImGui::NavUpdate()");
      }
      IVar49 = NavCalcPreferredRefPos();
      (pIVar16->IO).MousePosPrev = IVar49;
      (pIVar16->IO).MousePos = IVar49;
      (pIVar16->IO).WantSetMousePos = true;
    }
    pIVar16->NavMousePosDirty = false;
  }
  pIVar16->NavIdIsAlive = false;
  pIVar16->NavJustTabbedId = 0;
  uVar44 = pIVar16->NavLayer;
  if (1 < uVar44) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xc1b,"void ImGui::NavUpdate()");
  }
  pIVar29 = pIVar16->NavWindow;
  pIVar31 = pIVar29;
  if (pIVar29 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar31->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar31 != pIVar29) {
          pIVar31->NavLastChildNavWindow = pIVar29;
        }
        break;
      }
      ppIVar12 = &pIVar31->ParentWindow;
      pIVar31 = *ppIVar12;
    } while (*ppIVar12 != (ImGuiWindow *)0x0);
    if (((pIVar29 != (ImGuiWindow *)0x0) && (uVar44 == 0)) &&
       (pIVar29->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar29->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar17 = GImGui;
  if (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0) {
    bVar42 = (GImGui->IO).NavInputsDownDuration[3] == 0.0;
    if ((((GImGui->IO).KeyCtrl != true) || (iVar32 = (GImGui->IO).KeyMap[0], iVar32 < 0)) ||
       (bVar19 = IsKeyPressed(iVar32,true), !bVar19)) goto LAB_0014d32c;
    bVar43 = (byte)(pIVar17->IO).ConfigFlags & 1;
  }
  else {
    bVar42 = false;
LAB_0014d32c:
    bVar43 = 0;
  }
  if (bVar42 || bVar43 != 0) {
    pIVar29 = pIVar17->NavWindow;
    if (pIVar29 == (ImGuiWindow *)0x0) {
      pIVar29 = FindWindowNavigable((pIVar17->Windows).Size + -1,-0x7fffffff,-1);
    }
    if (pIVar29 != (ImGuiWindow *)0x0) {
      pIVar17->NavWindowingTarget = pIVar29->RootWindowForTabbing;
      pIVar17->NavWindowingHighlightTimer = 0.0;
      pIVar17->NavWindowingHighlightAlpha = 0.0;
      pIVar17->NavWindowingToggleLayer = (bool)(bVar43 ^ 1);
      pIVar17->NavInputSource = ImGuiInputSource_NavGamepad - bVar43;
    }
  }
  fVar46 = (pIVar17->IO).DeltaTime + pIVar17->NavWindowingHighlightTimer;
  pIVar17->NavWindowingHighlightTimer = fVar46;
  if ((pIVar17->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     (pIVar17->NavInputSource != ImGuiInputSource_NavGamepad)) {
LAB_0014d47e:
    bVar42 = false;
    pIVar29 = (ImGuiWindow *)0x0;
  }
  else {
    fVar53 = (fVar46 + -0.2) / 0.05;
    fVar46 = 1.0;
    if (fVar53 <= 1.0) {
      fVar46 = fVar53;
    }
    fVar46 = (float)(~-(uint)(fVar53 < 0.0) & (uint)fVar46);
    uVar44 = -(uint)(fVar46 <= pIVar17->NavWindowingHighlightAlpha);
    pIVar17->NavWindowingHighlightAlpha =
         (float)(uVar44 & (uint)pIVar17->NavWindowingHighlightAlpha | ~uVar44 & (uint)fVar46);
    fVar46 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
    fVar53 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
    iVar32 = (uint)(0.0 < fVar46) - (uint)(0.0 < fVar53);
    if (iVar32 != 0) {
      NavUpdateWindowingHighlightWindow(iVar32);
      pIVar17->NavWindowingHighlightAlpha = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) goto LAB_0014d47e;
    pbVar1 = &pIVar17->NavWindowingToggleLayer;
    *pbVar1 = (bool)(*pbVar1 &
                    (pIVar17->NavWindowingHighlightAlpha <= 1.0 &&
                    pIVar17->NavWindowingHighlightAlpha != 1.0));
    if (*pbVar1 == false) {
      pIVar29 = pIVar17->NavWindowingTarget;
      bVar42 = false;
    }
    else {
      bVar42 = pIVar17->NavWindow != (ImGuiWindow *)0x0;
      pIVar29 = (ImGuiWindow *)0x0;
    }
    pIVar17->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar17->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (pIVar17->NavInputSource == ImGuiInputSource_NavKeyboard)) {
    fVar53 = (pIVar17->NavWindowingHighlightTimer + -0.15) / 0.04;
    fVar46 = 1.0;
    if (fVar53 <= 1.0) {
      fVar46 = fVar53;
    }
    fVar46 = (float)(~-(uint)(fVar53 < 0.0) & (uint)fVar46);
    uVar44 = -(uint)(fVar46 <= pIVar17->NavWindowingHighlightAlpha);
    pIVar17->NavWindowingHighlightAlpha =
         (float)(uVar44 & (uint)pIVar17->NavWindowingHighlightAlpha | ~uVar44 & (uint)fVar46);
    iVar32 = (GImGui->IO).KeyMap[0];
    if ((-1 < iVar32) && (bVar19 = IsKeyPressed(iVar32,true), bVar19)) {
      NavUpdateWindowingHighlightWindow((pIVar17->IO).KeyShift - 1 | 1);
    }
    if ((pIVar17->IO).KeyCtrl == false) {
      pIVar29 = pIVar17->NavWindowingTarget;
    }
  }
  bVar19 = bVar42;
  if ((((pIVar17->ActiveId == 0) || (pIVar17->ActiveIdAllowOverlap == true)) &&
      (pfVar5 = (GImGui->IO).NavInputsDownDuration + 0x10, *pfVar5 <= 0.0 && *pfVar5 != 0.0)) &&
     (0.0 <= (GImGui->IO).NavInputsDownDurationPrev[0x10])) {
    if (-256000.0 <= (pIVar17->IO).MousePos.x) {
      bVar20 = -256000.0 <= (pIVar17->IO).MousePos.y;
    }
    else {
      bVar20 = false;
    }
    if (-256000.0 <= (pIVar17->IO).MousePosPrev.x) {
      bVar30 = -256000.0 <= (pIVar17->IO).MousePosPrev.y;
    }
    else {
      bVar30 = false;
    }
    bVar19 = true;
    if (bVar20 != bVar30) {
      bVar19 = bVar42;
    }
  }
  pIVar31 = pIVar17->NavWindowingTarget;
  if ((pIVar31 != (ImGuiWindow *)0x0) && (uVar44 = pIVar31->Flags, (uVar44 & 4) == 0)) {
    IVar8 = pIVar17->NavInputSource;
    IVar49.x = 0.0;
    IVar49.y = 0.0;
    if ((IVar8 == ImGuiInputSource_NavKeyboard) && ((pIVar17->IO).KeyShift == false)) {
      IVar49 = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
    }
    if (IVar8 == ImGuiInputSource_NavGamepad) {
      IVar49 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.0,0.0);
    }
    fVar46 = IVar49.y;
    if (((IVar49.x != 0.0) || (fVar46 != 0.0)) || (NAN(fVar46))) {
      fVar53 = (pIVar17->IO).DisplayFramebufferScale.x;
      fVar48 = (pIVar17->IO).DisplayFramebufferScale.y;
      if (fVar48 <= fVar53) {
        fVar53 = fVar48;
      }
      fVar53 = (float)(int)(fVar53 * (pIVar17->IO).DeltaTime * 800.0);
      (pIVar31->Pos).x = IVar49.x * fVar53 + (pIVar31->Pos).x;
      (pIVar31->Pos).y = fVar46 * fVar53 + (pIVar31->Pos).y;
      pIVar17->NavDisableMouseHover = true;
      if (((uVar44 >> 8 & 1) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
        GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
      }
    }
  }
  if (pIVar29 != (ImGuiWindow *)0x0) {
    if ((pIVar17->NavWindow == (ImGuiWindow *)0x0) ||
       (pIVar29 != pIVar17->NavWindow->RootWindowForTabbing)) {
      pIVar17->NavDisableHighlight = false;
      pIVar17->NavDisableMouseHover = true;
      pIVar31 = pIVar29->NavLastChildNavWindow;
      if (pIVar29->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        pIVar31 = pIVar29;
      }
      ClosePopupsOverWindow(pIVar31);
      FocusWindow(pIVar31);
      if (pIVar31->NavLastIds[0] == 0) {
        NavInitWindow(pIVar31,false);
      }
      if ((pIVar31->DC).NavLayerActiveMask == 2) {
        pIVar17->NavLayer = 1;
      }
    }
    pIVar17->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar19) && (pIVar29 = pIVar17->NavWindow, pIVar29 != (ImGuiWindow *)0x0)) {
    bVar43 = (byte)(pIVar29->DC).NavLayerActiveMask;
    pIVar31 = pIVar29;
    while (((bVar43 & 2) == 0 && ((pIVar31->Flags & 0x15000000U) == 0x1000000))) {
      pIVar31 = pIVar31->ParentWindow;
      bVar43 = (byte)(pIVar31->DC).NavLayerActiveMask;
    }
    if (pIVar31 != pIVar29) {
      FocusWindow(pIVar31);
      pIVar31->NavLastChildNavWindow = pIVar29;
    }
    pIVar17->NavDisableHighlight = false;
    pIVar17->NavDisableMouseHover = true;
    uVar44 = 0;
    if (((pIVar17->NavWindow->DC).NavLayerActiveMask & 2) != 0) {
      uVar44 = pIVar17->NavLayer ^ 1;
    }
    NavRestoreLayer(uVar44);
  }
  uVar44 = (pIVar16->IO).ConfigFlags;
  if ((uVar44 & 2) == 0) {
    bVar43 = 0;
  }
  else {
    bVar43 = (byte)(pIVar16->IO).BackendFlags & 1;
  }
  if ((((uVar44 & 1) == 0) && (bVar43 == 0)) || (pIVar16->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar16->IO).NavActive = false;
LAB_0014d86a:
    bVar42 = true;
    if (pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0) {
      bVar42 = pIVar16->NavInitRequest;
    }
  }
  else {
    bVar42 = (pIVar16->NavWindow->Flags & 0x40000U) == 0;
    (pIVar16->IO).NavActive = bVar42;
    if (((!bVar42) || (pIVar16->NavId == 0)) ||
       (bVar42 = true, pIVar16->NavDisableHighlight != false)) goto LAB_0014d86a;
  }
  (pIVar16->IO).NavVisible = bVar42;
  pIVar17 = GImGui;
  fVar46 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar46 == 0.0) && (!NAN(fVar46))) {
    if (pIVar16->ActiveId == 0) {
      pIVar29 = pIVar16->NavWindow;
      if (((pIVar29 == (ImGuiWindow *)0x0) || ((pIVar29->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar29->ParentWindow == (ImGuiWindow *)0x0)) {
        iVar32 = (pIVar16->OpenPopupStack).Size;
        if ((long)iVar32 < 1) {
          if (pIVar16->NavLayer == 0) {
            if ((pIVar29 != (ImGuiWindow *)0x0) && ((pIVar29->Flags & 0x5000000U) != 0x1000000)) {
              pIVar29->NavLastIds[0] = 0;
            }
            pIVar16->NavId = 0;
          }
          else {
            NavRestoreLayer(0);
          }
        }
        else if ((((pIVar16->OpenPopupStack).Data[(long)iVar32 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar32 + -1);
        }
      }
      else {
        if (pIVar29->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                        ,0xc37,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar29->ParentWindow);
        ppIVar12 = &GImGui->NavWindow;
        if (*ppIVar12 == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                        ,0x7f7,"void SetNavID(ImGuiID, int)");
        }
        IVar7 = pIVar29->ChildId;
        GImGui->NavId = IVar7;
        (*ppIVar12)->NavLastIds[0] = IVar7;
        pIVar16->NavIdIsAlive = false;
        if (pIVar16->NavDisableMouseHover == true) {
          pIVar16->NavMousePosDirty = true;
        }
      }
    }
    else {
      bVar42 = GImGui->ActiveId != 0;
      GImGui->ActiveIdIsJustActivated = bVar42;
      if (bVar42) {
        pIVar17->ActiveIdTimer = 0.0;
      }
      pIVar17->ActiveId = 0;
      pIVar17->ActiveIdAllowNavDirFlags = 0;
      pIVar17->ActiveIdAllowOverlap = false;
      pIVar17->ActiveIdWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar16->NavActivateId = 0;
  pIVar16->NavActivateDownId = 0;
  pIVar16->NavActivatePressedId = 0;
  pIVar17 = GImGui;
  pIVar16->NavInputId = 0;
  IVar7 = pIVar16->NavId;
  if (((IVar7 != 0) && (pIVar16->NavDisableHighlight == false)) &&
     ((pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0 &&
      ((pIVar16->NavWindow != (ImGuiWindow *)0x0 && ((pIVar16->NavWindow->Flags & 0x40000) == 0)))))
     ) {
    fVar46 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar46) {
      bVar42 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
    }
    else {
      bVar42 = false;
    }
    IVar9 = pIVar16->ActiveId;
    if (bVar42 && IVar9 == 0) {
      pIVar16->NavActivateId = IVar7;
    }
    if (IVar9 == 0) {
      if (0.0 < fVar46) goto LAB_0014ec4f;
    }
    else if (IVar9 == IVar7 && 0.0 < fVar46) {
LAB_0014ec4f:
      pIVar16->NavActivateDownId = IVar7;
    }
    if (IVar9 == 0) {
      if (bVar42) goto LAB_0014ec66;
    }
    else if ((bool)(bVar42 & IVar9 == IVar7)) {
LAB_0014ec66:
      pIVar16->NavActivatePressedId = IVar7;
    }
    if (((IVar9 == 0 || IVar9 == IVar7) &&
        (fVar46 = (pIVar17->IO).NavInputsDownDuration[2], fVar46 == 0.0)) && (!NAN(fVar46))) {
      pIVar16->NavInputId = IVar7;
    }
  }
  pIVar29 = pIVar16->NavWindow;
  if ((pIVar29 != (ImGuiWindow *)0x0) && ((pIVar29->Flags & 0x40000) != 0)) {
    pIVar16->NavDisableHighlight = true;
  }
  IVar9 = pIVar16->NavActivateId;
  if ((IVar9 != 0) && (pIVar16->NavActivateDownId != IVar9)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xc64,"void ImGui::NavUpdate()");
  }
  pIVar16->NavMoveRequest = false;
  IVar9 = pIVar16->NavNextActivateId;
  if (IVar9 != 0) {
    pIVar16->NavInputId = IVar9;
    pIVar16->NavActivatePressedId = IVar9;
    pIVar16->NavActivateDownId = IVar9;
    pIVar16->NavActivateId = IVar9;
  }
  pIVar16->NavNextActivateId = 0;
  if (pIVar16->ActiveId == 0) {
    uVar44 = 0xffffffff;
  }
  else {
    uVar44 = pIVar16->ActiveIdAllowNavDirFlags;
  }
  if (pIVar16->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar16->NavMoveDir = -1;
    if (((pIVar29 != (ImGuiWindow *)0x0) &&
        (uVar44 != 0 && pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar29->Flags & 0x40000) == 0)) {
      if ((uVar44 & 1) != 0) {
        fVar46 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat);
        fVar53 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar53 + fVar46) {
          pIVar16->NavMoveDir = 0;
        }
      }
      if ((uVar44 & 2) != 0) {
        fVar46 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat);
        fVar53 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar53 + fVar46) {
          pIVar16->NavMoveDir = 1;
        }
      }
      if ((uVar44 & 4) != 0) {
        fVar46 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat);
        fVar53 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar53 + fVar46) {
          pIVar16->NavMoveDir = 2;
        }
      }
      if ((uVar44 & 8) != 0) {
        fVar46 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat);
        fVar53 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar53 + fVar46) {
          pIVar16->NavMoveDir = 3;
        }
      }
    }
  }
  else {
    if (pIVar16->NavMoveDir == -1) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xc7c,"void ImGui::NavUpdate()");
    }
    if (pIVar16->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xc7d,"void ImGui::NavUpdate()");
    }
    pIVar16->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  uVar44 = pIVar16->NavMoveDir;
  if (uVar44 != 0xffffffff) {
    pIVar16->NavMoveRequest = true;
    pIVar16->NavMoveDirLast = uVar44;
  }
  bVar42 = pIVar16->NavMoveRequest;
  if (bVar42 == true && IVar7 == 0) {
    pIVar16->NavInitRequest = true;
    pIVar16->NavInitRequestFromMove = true;
    pIVar16->NavInitResultId = 0;
    pIVar16->NavDisableHighlight = false;
  }
  pIVar17 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar1 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar1;
    if (*pbVar1 != false) goto LAB_0014da64;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_0014da64:
    if (pIVar17->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0x935,"void NavUpdateAnyRequestFlag()");
    }
  }
  if (((pIVar29 != (ImGuiWindow *)0x0) && ((pIVar29->Flags & 0x40000) == 0)) &&
     (pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar46 = (float)(int)(pIVar17->FontBaseSize * pIVar29->FontWindowScale * 100.0 *
                          (pIVar16->IO).DeltaTime + 0.5);
    if (((pIVar29->DC).NavLayerActiveMask == 0) && (((pIVar29->DC).NavHasScroll & bVar42) == 1)) {
      if (uVar44 < 2) {
        fVar53 = (pIVar29->Scroll).x;
        fVar48 = (pIVar29->DC).CursorMaxPos.x;
        fVar54 = (float)(int)(*(float *)(&DAT_001ab698 + (ulong)(uVar44 == 0) * 4) * fVar46 + fVar53
                             );
        (pIVar29->Scroll).x = fVar54;
        (pIVar29->DC).CursorMaxPos.x = (fVar53 + fVar48) - fVar54;
      }
      if ((uVar44 & 0xfffffffe) == 2) {
        fVar53 = (pIVar29->Scroll).y;
        fVar48 = (pIVar29->DC).CursorMaxPos.y;
        fVar54 = (float)(int)(*(float *)(&DAT_001ab698 + (ulong)(uVar44 == 2) * 4) * fVar46 + fVar53
                             );
        (pIVar29->Scroll).y = fVar54;
        (pIVar29->DC).CursorMaxPos.y = (fVar53 + fVar48) - fVar54;
      }
    }
    IVar49 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar53 = IVar49.x;
    fVar48 = IVar49.y;
    if (((fVar53 != 0.0) || (NAN(fVar53))) && (pIVar29->ScrollbarX == true)) {
      fVar54 = (pIVar29->Scroll).x;
      fVar47 = (float)(int)(fVar53 * fVar46 + fVar54);
      fVar53 = (pIVar29->DC).CursorMaxPos.x;
      (pIVar29->Scroll).x = fVar47;
      (pIVar29->DC).CursorMaxPos.x = (fVar54 + fVar53) - fVar47;
      pIVar16->NavMoveFromClampedRefRect = true;
    }
    if ((fVar48 != 0.0) || (NAN(fVar48))) {
      fVar53 = (pIVar29->Scroll).y;
      fVar48 = (float)(int)(fVar48 * fVar46 + fVar53);
      fVar46 = (pIVar29->DC).CursorMaxPos.y;
      (pIVar29->Scroll).y = fVar48;
      (pIVar29->DC).CursorMaxPos.y = (fVar53 + fVar46) - fVar48;
      pIVar16->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar16->NavMoveResultLocal).ID = 0;
  (pIVar16->NavMoveResultLocal).ParentID = 0;
  (pIVar16->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar16->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar16->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar16->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar16->NavMoveResultLocal).RectRel.Min.x = 3.4028235e+38;
  (pIVar16->NavMoveResultLocal).RectRel.Min.y = 3.4028235e+38;
  (pIVar16->NavMoveResultLocal).RectRel.Max.x = -3.4028235e+38;
  (pIVar16->NavMoveResultLocal).RectRel.Max.y = -3.4028235e+38;
  (pIVar16->NavMoveResultOther).ID = 0;
  (pIVar16->NavMoveResultOther).ParentID = 0;
  (pIVar16->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar16->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar16->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar16->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar16->NavMoveResultOther).RectRel.Min.x = 3.4028235e+38;
  (pIVar16->NavMoveResultOther).RectRel.Min.y = 3.4028235e+38;
  (pIVar16->NavMoveResultOther).RectRel.Max.x = -3.4028235e+38;
  (pIVar16->NavMoveResultOther).RectRel.Max.y = -3.4028235e+38;
  if (((bVar42 != false) && (pIVar16->NavMoveFromClampedRefRect == true)) &&
     (pIVar16->NavLayer == 0)) {
    fVar46 = (pIVar29->Pos).x;
    fVar53 = (pIVar29->Pos).y;
    fVar47 = ((pIVar29->InnerRect).Min.x - fVar46) + -1.0;
    fVar54 = ((pIVar29->InnerRect).Min.y - fVar53) + -1.0;
    fVar48 = ((pIVar29->InnerRect).Max.x - fVar46) + 1.0;
    fVar53 = ((pIVar29->InnerRect).Max.y - fVar53) + 1.0;
    fVar46 = pIVar29->NavRectRel[0].Min.x;
    if ((((fVar46 < fVar47) || (pIVar29->NavRectRel[0].Min.y < fVar54)) ||
        (fVar48 < pIVar29->NavRectRel[0].Max.x)) || (fVar53 < pIVar29->NavRectRel[0].Max.y)) {
      fVar56 = pIVar17->FontBaseSize * pIVar29->FontWindowScale * 0.5;
      fVar52 = fVar48 - fVar47;
      if (fVar56 <= fVar48 - fVar47) {
        fVar52 = fVar56;
      }
      fVar57 = fVar53 - fVar54;
      if (fVar56 <= fVar53 - fVar54) {
        fVar57 = fVar56;
      }
      uVar44 = -(uint)(fVar47 + fVar52 <= fVar46);
      fVar56 = pIVar29->NavRectRel[0].Min.y;
      fVar58 = pIVar29->NavRectRel[0].Max.x;
      uVar45 = -(uint)(fVar54 + fVar57 <= fVar56);
      IVar59.y = (float)(uVar45 & (uint)fVar56 | ~uVar45 & (uint)(fVar54 + fVar57));
      IVar59.x = (float)(uVar44 & (uint)fVar46 | ~uVar44 & (uint)(fVar47 + fVar52));
      pIVar29->NavRectRel[0].Min = IVar59;
      if (fVar48 - fVar52 <= fVar58) {
        fVar58 = fVar48 - fVar52;
      }
      fVar46 = pIVar29->NavRectRel[0].Max.y;
      if (fVar53 - fVar57 <= fVar46) {
        fVar46 = fVar53 - fVar57;
      }
      IVar14.y = fVar46;
      IVar14.x = fVar58;
      pIVar29->NavRectRel[0].Max = IVar14;
      pIVar16->NavId = 0;
    }
    pIVar16->NavMoveFromClampedRefRect = false;
  }
  pIVar29 = pIVar16->NavWindow;
  if (pIVar29 == (ImGuiWindow *)0x0) {
LAB_0014de1a:
    fVar54 = 0.0;
    fVar53 = 0.0;
    fVar48 = 0.0;
    fVar46 = 0.0;
  }
  else {
    iVar32 = pIVar16->NavLayer;
    fVar46 = pIVar29->NavRectRel[iVar32].Min.x;
    fVar53 = pIVar29->NavRectRel[iVar32].Max.x;
    if (fVar53 < fVar46) goto LAB_0014de1a;
    fVar48 = pIVar29->NavRectRel[iVar32].Min.y;
    fVar54 = pIVar29->NavRectRel[iVar32].Max.y;
    if (fVar54 < fVar48) goto LAB_0014de1a;
  }
  if (pIVar29 == (ImGuiWindow *)0x0) {
    fVar46 = (GImGui->IO).DisplayVisibleMin.x;
    pIVar4 = &(GImGui->IO).DisplayVisibleMax;
    if ((fVar46 != pIVar4->x) || (NAN(fVar46) || NAN(pIVar4->x))) {
      fVar46 = (GImGui->IO).DisplayVisibleMin.y;
      pfVar5 = &(GImGui->IO).DisplayVisibleMax.y;
      if ((fVar46 != *pfVar5) || (NAN(fVar46) || NAN(*pfVar5))) {
        IVar55 = (GImGui->IO).DisplayVisibleMin;
        IVar50 = (GImGui->IO).DisplayVisibleMax;
        goto LAB_0014e086;
      }
    }
    IVar50 = (GImGui->IO).DisplaySize;
    IVar55.x = 0.0;
    IVar55.y = 0.0;
  }
  else {
    fVar47 = (pIVar29->Pos).x;
    fVar52 = (pIVar29->Pos).y;
    IVar55.x = fVar46 + fVar47;
    IVar55.y = fVar48 + fVar52;
    IVar50.x = fVar53 + fVar47;
    IVar50.y = fVar54 + fVar52;
  }
LAB_0014e086:
  (pIVar16->NavScoringRectScreen).Min = IVar55;
  (pIVar16->NavScoringRectScreen).Max = IVar50;
  fVar48 = (pIVar16->NavScoringRectScreen).Min.x + 1.0;
  fVar46 = (pIVar16->NavScoringRectScreen).Min.y;
  fVar53 = (pIVar16->NavScoringRectScreen).Max.x;
  if (fVar53 <= fVar48) {
    fVar48 = fVar53;
  }
  (pIVar16->NavScoringRectScreen).Min.x = fVar48;
  (pIVar16->NavScoringRectScreen).Max.x = fVar48;
  pfVar5 = &(pIVar16->NavScoringRectScreen).Max.y;
  if (*pfVar5 <= fVar46 && fVar46 != *pfVar5) {
    __assert_fail("!g.NavScoringRectScreen.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xcc6,"void ImGui::NavUpdate()");
  }
  pIVar16->NavScoringCount = 0;
  pIVar16 = GImGui;
  fVar46 = (GImGui->IO).MousePos.x;
  if (((fVar46 < -256000.0) || (fVar53 = (GImGui->IO).MousePos.y, fVar53 < -256000.0)) ||
     ((fVar48 = (GImGui->IO).MousePosPrev.x, fVar48 < -256000.0 ||
      (fVar54 = (GImGui->IO).MousePosPrev.y, fVar54 < -256000.0)))) {
    (pIVar16->IO).MouseDelta.x = 0.0;
    (pIVar16->IO).MouseDelta.y = 0.0;
  }
  else {
    IVar51.x = fVar46 - fVar48;
    IVar51.y = fVar53 - fVar54;
    (GImGui->IO).MouseDelta = IVar51;
  }
  if ((((pIVar16->IO).MouseDelta.x != 0.0) || (fVar46 = (pIVar16->IO).MouseDelta.y, fVar46 != 0.0))
     || (NAN(fVar46))) {
    pIVar16->NavDisableMouseHover = false;
  }
  IVar49 = (pIVar16->IO).MousePos;
  (pIVar16->IO).MousePosPrev = IVar49;
  lVar22 = 0x40a;
  do {
    cVar6 = *(char *)((long)pIVar16 + lVar22 + -0x2fa);
    if (cVar6 == '\x01') {
      pfVar5 = (float *)((long)pIVar16 + lVar22 * 4 + -0xc14);
      bVar42 = *pfVar5 <= 0.0 && *pfVar5 != 0.0;
    }
    else {
      bVar42 = false;
    }
    *(bool *)((long)(pIVar16->IO).KeyMap + lVar22 + -0x46) = bVar42;
    if (cVar6 == '\0') {
      bVar19 = 0.0 <= *(float *)((long)pIVar16 + lVar22 * 4 + -0xc14);
    }
    else {
      bVar19 = false;
    }
    *(bool *)((long)(pIVar16->IO).KeyMap + lVar22 + -0x3c) = bVar19;
    fVar46 = *(float *)((long)pIVar16 + lVar22 * 4 + -0xc14);
    *(float *)((long)pIVar16 + lVar22 * 4 + -0xc00) = fVar46;
    fVar53 = -1.0;
    if ((cVar6 != '\0') && (fVar53 = 0.0, 0.0 <= fVar46)) {
      fVar53 = fVar46 + (pIVar16->IO).DeltaTime;
    }
    *(float *)((long)pIVar16 + lVar22 * 4 + -0xc14) = fVar53;
    *(undefined1 *)((long)(pIVar16->IO).KeyMap + lVar22 + -0x41) = 0;
    if (bVar42 == false) {
      if (cVar6 != '\0') {
        fVar53 = (pIVar16->IO).MousePos.x - *(float *)((long)pIVar16 + lVar22 * 8 + -0x1c8c);
        fVar48 = (pIVar16->IO).MousePos.y - *(float *)((long)pIVar16 + lVar22 * 8 + -0x1c88);
        fVar46 = -fVar53;
        if (-fVar53 <= fVar53) {
          fVar46 = fVar53;
        }
        fVar54 = *(float *)((long)pIVar16 + lVar22 * 8 + -0x1c14);
        fVar47 = *(float *)((long)pIVar16 + lVar22 * 8 + -0x1c10);
        uVar44 = -(uint)(fVar46 <= fVar54);
        *(uint *)((long)pIVar16 + lVar22 * 8 + -0x1c14) =
             uVar44 & (uint)fVar54 | ~uVar44 & (uint)fVar46;
        fVar46 = -fVar48;
        if (-fVar48 <= fVar48) {
          fVar46 = fVar48;
        }
        uVar44 = -(uint)(fVar46 <= fVar47);
        *(uint *)((long)pIVar16 + lVar22 * 8 + -0x1c10) =
             uVar44 & (uint)fVar47 | ~uVar44 & (uint)fVar46;
        fVar46 = *(float *)((long)pIVar16 + lVar22 * 4 + -0xbc4);
        fVar53 = fVar53 * fVar53 + fVar48 * fVar48;
        uVar44 = -(uint)(fVar53 <= fVar46);
        *(uint *)((long)pIVar16 + lVar22 * 4 + -0xbc4) =
             uVar44 & (uint)fVar46 | ~uVar44 & (uint)fVar53;
      }
    }
    else {
      fVar46 = pIVar16->Time;
      if ((fVar46 - *(float *)((long)pIVar16 + lVar22 * 4 + -0xc3c) <
           (pIVar16->IO).MouseDoubleClickTime) &&
         (fVar48 = (pIVar16->IO).MousePos.x - *(float *)((long)pIVar16 + lVar22 * 8 + -0x1c8c),
         fVar54 = (pIVar16->IO).MousePos.y - *(float *)((long)pIVar16 + lVar22 * 8 + -0x1c88),
         fVar53 = (pIVar16->IO).MouseDoubleClickMaxDist, fVar46 = -3.4028235e+38,
         fVar48 * fVar48 + fVar54 * fVar54 < fVar53 * fVar53)) {
        *(undefined1 *)((long)(pIVar16->IO).KeyMap + lVar22 + -0x41) = 1;
        fVar46 = -3.4028235e+38;
      }
      *(float *)((long)pIVar16 + lVar22 * 4 + -0xc3c) = fVar46;
      *(ImVec2 *)((long)pIVar16 + lVar22 * 8 + -0x1c8c) = IVar49;
      *(undefined8 *)((long)pIVar16 + lVar22 * 8 + -0x1c14) = 0;
      *(undefined4 *)((long)pIVar16 + lVar22 * 4 + -0xbc4) = 0;
    }
    if (*(char *)((long)(pIVar16->IO).KeyMap + lVar22 + -0x46) == '\x01') {
      pIVar16->NavDisableMouseHover = false;
    }
    lVar22 = lVar22 + 1;
  } while (lVar22 != 0x40f);
  fVar46 = (pIVar15->IO).DeltaTime;
  iVar32 = pIVar15->FramerateSecPerFrameIdx;
  pIVar15->FramerateSecPerFrameAccum =
       (fVar46 - pIVar15->FramerateSecPerFrame[iVar32]) + pIVar15->FramerateSecPerFrameAccum;
  pIVar15->FramerateSecPerFrame[iVar32] = fVar46;
  iVar21 = iVar32 + (int)((ulong)((long)(iVar32 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar15->FramerateSecPerFrameIdx = iVar32 + 1 + ((iVar21 >> 6) - (iVar21 >> 0x1f)) * -0x78;
  uVar44 = -(uint)(0.0 < pIVar15->FramerateSecPerFrameAccum);
  (pIVar15->IO).Framerate =
       (float)(~uVar44 & 0x7f7fffff |
              (uint)(1.0 / (pIVar15->FramerateSecPerFrameAccum / 120.0)) & uVar44);
  pIVar16 = GImGui;
  ppIVar12 = &GImGui->MovingWindow;
  if (*ppIVar12 == (ImGuiWindow *)0x0) {
    if (((GImGui->ActiveIdWindow != (ImGuiWindow *)0x0) &&
        (IVar7 = GImGui->ActiveId, GImGui->ActiveIdWindow->MoveId == IVar7)) &&
       (GImGui->ActiveIdIsAlive = true, (pIVar16->IO).MouseDown[0] == false)) {
      pIVar16->ActiveIdIsJustActivated = IVar7 != 0;
      if (IVar7 != 0) {
        pIVar16->ActiveIdTimer = 0.0;
      }
      pIVar16->ActiveId = 0;
      pIVar16->ActiveIdAllowNavDirFlags = 0;
      pIVar16->ActiveIdAllowOverlap = false;
      pIVar16->ActiveIdWindow = (ImGuiWindow *)0x0;
    }
    goto LAB_0014e63c;
  }
  pIVar2 = &GImGui->ActiveId;
  GImGui->ActiveIdIsAlive = true;
  pIVar29 = (*ppIVar12)->RootWindow;
  if (pIVar29 == (ImGuiWindow *)0x0) {
    __assert_fail("g.MovingWindow && g.MovingWindow->RootWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xcd7,"void ImGui::UpdateMovingWindow()");
  }
  if ((((pIVar16->IO).MouseDown[0] != true) ||
      (fVar46 = (pIVar16->IO).MousePos.x, fVar46 < -256000.0)) ||
     (fVar53 = (pIVar16->IO).MousePos.y, fVar53 < -256000.0)) {
    bVar42 = *pIVar2 != 0;
    pIVar16->ActiveIdIsJustActivated = bVar42;
    if (bVar42) {
      pIVar16->ActiveIdTimer = 0.0;
    }
    pIVar16->ActiveId = 0;
    pIVar16->ActiveIdAllowNavDirFlags = 0;
    pIVar16->ActiveIdAllowOverlap = false;
    pIVar16->ActiveIdWindow = (ImGuiWindow *)0x0;
    pIVar16->MovingWindow = (ImGuiWindow *)0x0;
    goto LAB_0014e63c;
  }
  local_40.x = fVar46 - (pIVar16->ActiveIdClickOffset).x;
  fVar53 = fVar53 - (pIVar16->ActiveIdClickOffset).y;
  local_40.y = fVar53;
  fVar46 = (pIVar29->Pos).x;
  if ((fVar46 != local_40.x) || (NAN(fVar46) || NAN(local_40.x))) {
LAB_0014e602:
    if (((pIVar29->Flags & 0x100) == 0) && (pIVar16->SettingsDirtyTimer <= 0.0)) {
      pIVar16->SettingsDirtyTimer = (pIVar16->IO).IniSavingRate;
    }
    ::SetWindowPos(pIVar29,&local_40,1);
  }
  else {
    fVar46 = (pIVar29->Pos).y;
    if ((fVar46 != fVar53) || (NAN(fVar46) || NAN(fVar53))) goto LAB_0014e602;
  }
  FocusWindow(pIVar16->MovingWindow);
LAB_0014e63c:
  NewFrameUpdateHoveredWindowAndCaptureFlags();
  pIVar29 = GetFrontMostPopupModal();
  if (pIVar29 == (ImGuiWindow *)0x0) {
    fVar46 = 0.0;
  }
  else {
    fVar46 = (pIVar15->IO).DeltaTime * 6.0 + pIVar15->ModalWindowDarkeningRatio;
    if (1.0 <= fVar46) {
      fVar46 = 1.0;
    }
  }
  pIVar15->ModalWindowDarkeningRatio = fVar46;
  pIVar15->MouseCursor = 0;
  pIVar15->WantTextInputNextFrame = -1;
  pIVar15->WantCaptureMouseNextFrame = -1;
  pIVar15->WantCaptureKeyboardNextFrame = -1;
  (pIVar15->PlatformImePos).x = 1.0;
  (pIVar15->PlatformImePos).y = 1.0;
  pIVar29 = pIVar15->HoveredWindow;
  if (((pIVar29 != (ImGuiWindow *)0x0) && (pIVar29->Collapsed == false)) &&
     ((fVar46 = (pIVar15->IO).MouseWheel, pIVar31 = pIVar29, fVar46 != 0.0 ||
      ((fVar53 = (pIVar15->IO).MouseWheelH, fVar53 != 0.0 || (NAN(fVar53))))))) {
    do {
      pIVar35 = pIVar31;
      uVar44 = pIVar35->Flags;
      if ((uVar44 & 0x1000218) != 0x1000010) break;
      pIVar31 = pIVar35->ParentWindow;
    } while (pIVar35->ParentWindow != (ImGuiWindow *)0x0);
    if ((fVar46 != 0.0) || (NAN(fVar46))) {
      bVar42 = (pIVar15->IO).KeyCtrl;
      if ((bVar42 == true) && ((pIVar15->IO).FontAllowUserScaling == true)) {
        fVar53 = fVar46 * 0.1 + pIVar29->FontWindowScale;
        fVar46 = 2.5;
        if (fVar53 <= 2.5) {
          fVar46 = fVar53;
        }
        fVar46 = (float)(-(uint)(fVar53 < 0.5) & 0x3f000000 | ~-(uint)(fVar53 < 0.5) & (uint)fVar46)
        ;
        fVar52 = fVar46 / pIVar29->FontWindowScale;
        pIVar29->FontWindowScale = fVar46;
        fVar46 = (pIVar29->Size).x;
        fVar53 = (pIVar29->Size).y;
        fVar48 = (pIVar15->IO).MousePos.y;
        fVar54 = (pIVar29->Pos).x;
        fVar47 = (pIVar29->Pos).y;
        (pIVar29->Pos).x =
             (((pIVar15->IO).MousePos.x - fVar54) * fVar46 * (1.0 - fVar52)) / fVar46 + fVar54;
        (pIVar29->Pos).y = ((fVar48 - fVar47) * (1.0 - fVar52) * fVar53) / fVar53 + fVar47;
        (pIVar29->Size).x = fVar46 * fVar52;
        (pIVar29->Size).y = fVar53 * fVar52;
        (pIVar29->SizeFull).x = (pIVar29->SizeFull).x * fVar52;
        (pIVar29->SizeFull).y = fVar52 * (pIVar29->SizeFull).y;
      }
      else if ((uVar44 & 0x210) == 0 && bVar42 == false) {
        fVar48 = GImGui->FontBaseSize * pIVar35->FontWindowScale * 5.0;
        fVar53 = (pIVar35->WindowPadding).y;
        fVar53 = (fVar53 + fVar53 +
                 ((pIVar35->ContentsRegionRect).Max.y - (pIVar35->ContentsRegionRect).Min.y)) * 0.67
        ;
        if (fVar53 <= fVar48) {
          fVar48 = fVar53;
        }
        fVar53 = (pIVar35->Scroll).y;
        fVar54 = (pIVar35->DC).CursorMaxPos.y;
        fVar46 = fVar53 - fVar46 * (float)(int)fVar48;
        (pIVar35->Scroll).y = fVar46;
        (pIVar35->DC).CursorMaxPos.y = (fVar53 + fVar54) - fVar46;
      }
    }
    if ((uVar44 & 0x210) == 0) {
      fVar46 = (pIVar15->IO).MouseWheelH;
      if ((((fVar46 != 0.0) || (NAN(fVar46))) && ((pIVar15->IO).KeyCtrl == false)) &&
         ((pIVar29->Flags & 0x10) == 0)) {
        fVar53 = (pIVar29->Scroll).x;
        fVar48 = (pIVar29->DC).CursorMaxPos.x;
        fVar46 = fVar53 - fVar46 * GImGui->FontBaseSize * pIVar35->FontWindowScale;
        (pIVar29->Scroll).x = fVar46;
        (pIVar29->DC).CursorMaxPos.x = (fVar53 + fVar48) - fVar46;
      }
    }
  }
  if (((((pIVar15->ActiveId == 0) && (pIVar29 = pIVar15->NavWindow, pIVar29 != (ImGuiWindow *)0x0))
       && ((pIVar29->Active == true &&
           (((pIVar29->Flags & 0x40000) == 0 && ((pIVar15->IO).KeyCtrl == false)))))) &&
      (iVar32 = (GImGui->IO).KeyMap[0], -1 < iVar32)) &&
     (bVar42 = IsKeyPressed(iVar32,false), bVar42)) {
    if ((pIVar15->NavId == 0) || (pIVar15->NavIdTabCounter == 0x7fffffff)) {
      iVar32 = -(uint)(pIVar15->IO).KeyShift;
    }
    else {
      iVar32 = pIVar15->NavIdTabCounter + (-(uint)(pIVar15->IO).KeyShift | 1) + 1;
    }
    pIVar15->NavWindow->FocusIdxTabRequestNext = iVar32;
  }
  pIVar15->NavIdTabCounter = 0x7fffffff;
  uVar44 = (pIVar15->Windows).Size;
  if ((ulong)uVar44 != 0) {
    uVar25 = 0;
    if (0 < (int)uVar44) {
      uVar25 = (ulong)uVar44;
    }
    uVar34 = 0;
    do {
      if (uVar25 == uVar34) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                      ,0x49a,
                      "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      pIVar29 = (pIVar15->Windows).Data[uVar34];
      pIVar29->WasActive = pIVar29->Active;
      pIVar29->Active = false;
      pIVar29->WriteAccessed = false;
      uVar34 = uVar34 + 1;
    } while (uVar44 != uVar34);
  }
  if ((pIVar15->NavWindow != (ImGuiWindow *)0x0) && (pIVar15->NavWindow->WasActive == false)) {
    FocusFrontMostActiveWindow((ImGuiWindow *)0x0);
  }
  iVar32 = (pIVar15->CurrentWindowStack).Capacity;
  if (iVar32 < 0) {
    uVar44 = iVar32 / 2 + iVar32;
    uVar25 = 0;
    if (0 < (int)uVar44) {
      uVar25 = (ulong)uVar44;
    }
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar25 * 8,GImAllocatorUserData);
    ppIVar12 = (pIVar15->CurrentWindowStack).Data;
    if (ppIVar12 != (ImGuiWindow **)0x0) {
      memcpy(__dest,ppIVar12,(long)(pIVar15->CurrentWindowStack).Size << 3);
    }
    ppIVar12 = (pIVar15->CurrentWindowStack).Data;
    if (ppIVar12 != (ImGuiWindow **)0x0) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    }
    (*GImAllocatorFreeFunc)(ppIVar12,GImAllocatorUserData);
    (pIVar15->CurrentWindowStack).Data = __dest;
    (pIVar15->CurrentWindowStack).Capacity = (int)uVar25;
  }
  (pIVar15->CurrentWindowStack).Size = 0;
  iVar32 = (pIVar15->CurrentPopupStack).Capacity;
  if (iVar32 < 0) {
    uVar44 = iVar32 / 2 + iVar32;
    uVar25 = 0;
    if (0 < (int)uVar44) {
      uVar25 = (ulong)uVar44;
    }
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    __dest_00 = (ImGuiPopupRef *)(*GImAllocatorAllocFunc)(uVar25 * 0x30,GImAllocatorUserData);
    pIVar13 = (pIVar15->CurrentPopupStack).Data;
    if (pIVar13 != (ImGuiPopupRef *)0x0) {
      memcpy(__dest_00,pIVar13,(long)(pIVar15->CurrentPopupStack).Size * 0x30);
    }
    pIVar13 = (pIVar15->CurrentPopupStack).Data;
    if (pIVar13 != (ImGuiPopupRef *)0x0) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    }
    (*GImAllocatorFreeFunc)(pIVar13,GImAllocatorUserData);
    (pIVar15->CurrentPopupStack).Data = __dest_00;
    (pIVar15->CurrentPopupStack).Capacity = (int)uVar25;
  }
  (pIVar15->CurrentPopupStack).Size = 0;
  ClosePopupsOverWindow(pIVar15->NavWindow);
  pIVar15 = GImGui;
  (pIVar15->NextWindowData).SizeVal.x = 400.0;
  (pIVar15->NextWindowData).SizeVal.y = 400.0;
  (pIVar15->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() or ImGui::SetCurrentContext()?");
    ImGuiContext& g = *GImGui;

    // Check user data
    // (We pass an error message in the assert expression to make it visible to programmers who are not using a debugger, as most assert handlers display their argument)
    IM_ASSERT(g.Initialized);
    IM_ASSERT(g.IO.DeltaTime >= 0.0f                                    && "Need a positive DeltaTime (zero is tolerated but will cause some timing issues)");
    IM_ASSERT(g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f  && "Invalid DisplaySize value");
    IM_ASSERT(g.IO.Fonts->Fonts.Size > 0                                && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.IO.Fonts->Fonts[0]->IsLoaded()                          && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.Style.CurveTessellationTol > 0.0f                       && "Invalid style setting");
    IM_ASSERT(g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f            && "Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)");
    IM_ASSERT((g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount)  && "Forgot to call Render() or EndFrame() at the end of the previous frame?");
    for (int n = 0; n < ImGuiKey_COUNT; n++)
        IM_ASSERT(g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < IM_ARRAYSIZE(g.IO.KeysDown) && "io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)");

    // Perform simple check for required key mapping (we intentionally do NOT check all keys to not pressure user into setting up everything, but Space is required and was only recently added in 1.60 WIP)
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard)
        IM_ASSERT(g.IO.KeyMap[ImGuiKey_Space] != -1 && "ImGuiKey_Space is not mapped, required for keyboard navigation.");

    // Load settings on first frame
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
            SaveIniSettingsToDisk(g.IO.IniFilename);
    }

    g.Time += g.IO.DeltaTime;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;

    g.OverlayDrawList.Clear();
    g.OverlayDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.OverlayDrawList.PushClipRectFullScreen();
    g.OverlayDrawList.Flags = (g.Style.AntiAliasedLines ? ImDrawListFlags_AntiAliasedLines : 0) | (g.Style.AntiAliasedFill ? ImDrawListFlags_AntiAliasedFill : 0);

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it
    g.DrawData.Clear();

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (!g.ActiveIdIsAlive && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.ScalarAsInputTextId && g.ActiveId != g.ScalarAsInputTextId)
        g.ScalarAsInputTextId = 0;

    // Elapse drag & drop payload
    if (g.DragDropActive && g.DragDropPayload.DataFrameCount + 1 < g.FrameCount)
    {
        ClearDragDrop();
        g.DragDropPayloadBufHeap.clear();
        memset(&g.DragDropPayloadBufLocal, 0, sizeof(g.DragDropPayloadBufLocal));
    }
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMovingWindow();
    NewFrameUpdateHoveredWindowAndCaptureFlags();
    
    if (GetFrontMostPopupModal() != NULL)
        g.ModalWindowDarkeningRatio = ImMin(g.ModalWindowDarkeningRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.ModalWindowDarkeningRatio = 0.0f;

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    if (g.HoveredWindow && !g.HoveredWindow->Collapsed && (g.IO.MouseWheel != 0.0f || g.IO.MouseWheelH != 0.0f))
    {
        // If a child window has the ImGuiWindowFlags_NoScrollWithMouse flag, we give a chance to scroll its parent (unless either ImGuiWindowFlags_NoInputs or ImGuiWindowFlags_NoScrollbar are also set).
        ImGuiWindow* window = g.HoveredWindow;
        ImGuiWindow* scroll_window = window;
        while ((scroll_window->Flags & ImGuiWindowFlags_ChildWindow) && (scroll_window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(scroll_window->Flags & ImGuiWindowFlags_NoScrollbar) && !(scroll_window->Flags & ImGuiWindowFlags_NoInputs) && scroll_window->ParentWindow)
            scroll_window = scroll_window->ParentWindow;
        const bool scroll_allowed = !(scroll_window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(scroll_window->Flags & ImGuiWindowFlags_NoInputs);

        if (g.IO.MouseWheel != 0.0f)
        {
            if (g.IO.KeyCtrl && g.IO.FontAllowUserScaling)
            {
                // Zoom / Scale window
                const float new_font_scale = ImClamp(window->FontWindowScale + g.IO.MouseWheel * 0.10f, 0.50f, 2.50f);
                const float scale = new_font_scale / window->FontWindowScale;
                window->FontWindowScale = new_font_scale;

                const ImVec2 offset = window->Size * (1.0f - scale) * (g.IO.MousePos - window->Pos) / window->Size;
                window->Pos += offset;
                window->Size *= scale;
                window->SizeFull *= scale;
            }
            else if (!g.IO.KeyCtrl && scroll_allowed)
            {
                // Mouse wheel vertical scrolling
                float scroll_amount = 5 * scroll_window->CalcFontSize();
                scroll_amount = (float)(int)ImMin(scroll_amount, (scroll_window->ContentsRegionRect.GetHeight() + scroll_window->WindowPadding.y * 2.0f) * 0.67f);
                SetWindowScrollY(scroll_window, scroll_window->Scroll.y - g.IO.MouseWheel * scroll_amount);
            }
        }
        if (g.IO.MouseWheelH != 0.0f && scroll_allowed)
        {
            // Mouse wheel horizontal scrolling (for hardware that supports it)
            float scroll_amount = scroll_window->CalcFontSize();
            if (!g.IO.KeyCtrl && !(window->Flags & ImGuiWindowFlags_NoScrollWithMouse))
                SetWindowScrollX(window, window->Scroll.x - g.IO.MouseWheelH * scroll_amount);
        }
    }

    // Pressing TAB activate widget focus
    if (g.ActiveId == 0 && g.NavWindow != NULL && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab, false))
    {
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.NavWindow->FocusIdxTabRequestNext = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.NavWindow->FocusIdxTabRequestNext = g.IO.KeyShift ? -1 : 0;
    }
    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->Active = false;
        window->WriteAccessed = false;
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusFrontMostActiveWindow(NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.CurrentPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow);

    // Create implicit window - we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
}